

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O2

FString strbin1(char *start)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  byte *in_RSI;
  char cVar5;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  
  start[0] = -0x44;
  start[1] = -0xf;
  start[2] = '\x7f';
  start[3] = '\0';
  start[4] = '\0';
  start[5] = '\0';
  start[6] = '\0';
  start[7] = '\0';
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  do {
    while( true ) {
      pbVar6 = in_RSI + 1;
      bVar2 = *in_RSI;
      if (bVar2 == 0x5c) break;
      if (bVar2 == 0) {
        return (FString)start;
      }
      FString::operator+=((FString *)start,bVar2);
      in_RSI = pbVar6;
    }
    bVar2 = *pbVar6;
    if (bVar2 - 0x30 < 8) {
      pbVar6 = in_RSI + 4;
      cVar1 = '\0';
      for (lVar4 = 1; (int)lVar4 != 4; lVar4 = lVar4 + 1) {
        cVar1 = cVar1 * '\b';
        if ((in_RSI[lVar4] & 0xf8) != 0x30) {
          pbVar6 = in_RSI + lVar4;
          break;
        }
        cVar1 = in_RSI[lVar4] + cVar1 + -0x30;
      }
      FString::operator+=((FString *)start,cVar1);
    }
    else {
      switch(bVar2) {
      case 0x6e:
        bVar2 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x75:
      case 0x77:
        break;
      case 0x72:
        bVar2 = 0xd;
        break;
      case 0x74:
        bVar2 = 9;
        break;
      case 0x76:
        bVar2 = 0xb;
        break;
      case 0x78:
switchD_0042d323_caseD_78:
        cVar1 = '\0';
        iVar3 = 2;
        while (bVar8 = iVar3 != 0, iVar3 = iVar3 + -1, pbVar7 = in_RSI + 3, bVar8) {
          bVar2 = pbVar6[1];
          cVar5 = -0x30;
          if (((9 < (byte)(bVar2 - 0x30)) && (cVar5 = -0x57, 5 < (byte)(bVar2 + 0x9f))) &&
             (cVar5 = -0x37, pbVar7 = pbVar6, 5 < (byte)(bVar2 + 0xbf))) break;
          pbVar6 = pbVar6 + 1;
          cVar1 = cVar1 * '\x10' + cVar5 + bVar2;
        }
        FString::operator+=((FString *)start,cVar1);
        pbVar6 = pbVar7;
        goto LAB_0042d3cb;
      default:
        switch(bVar2) {
        case 0x61:
          bVar2 = 7;
          break;
        case 0x62:
          bVar2 = 8;
          break;
        case 99:
          bVar2 = 0x1c;
          break;
        case 100:
        case 0x65:
          break;
        case 0x66:
          bVar2 = 0xc;
          break;
        default:
          if (bVar2 == 10) goto LAB_0042d3cb;
          if ((bVar2 != 0x3f) && (bVar2 == 0x58)) goto switchD_0042d323_caseD_78;
        }
      }
      FString::operator+=((FString *)start,bVar2);
    }
LAB_0042d3cb:
    in_RSI = pbVar6 + 1;
  } while( true );
}

Assistant:

FString strbin1 (const char *start)
{
	FString result;
	const char *p = start;
	char c;
	int i;

	while ( (c = *p++) ) {
		if (c != '\\') {
			result << c;
		} else {
			switch (*p) {
				case 'a':
					result << '\a';
					break;
				case 'b':
					result << '\b';
					break;
				case 'c':
					result << '\034';	// TEXTCOLOR_ESCAPE
					break;
				case 'f':
					result << '\f';
					break;
				case 'n':
					result << '\n';
					break;
				case 't':
					result << '\t';
					break;
				case 'r':
					result << '\r';
					break;
				case 'v':
					result << '\v';
					break;
				case '?':
					result << '\?';
					break;
				case '\n':
					break;
				case 'x':
				case 'X':
					c = 0;
					for (i = 0; i < 2; i++)
					{
						p++;
						if (*p >= '0' && *p <= '9')
							c = (c << 4) + *p-'0';
						else if (*p >= 'a' && *p <= 'f')
							c = (c << 4) + 10 + *p-'a';
						else if (*p >= 'A' && *p <= 'F')
							c = (c << 4) + 10 + *p-'A';
						else
						{
							p--;
							break;
						}
					}
					result << c;
					break;
				case '0':
				case '1':
				case '2':
				case '3':
				case '4':
				case '5':
				case '6':
				case '7':
					c = 0;
					for (i = 0; i < 3; i++) {
						c <<= 3;
						if (*p >= '0' && *p <= '7')
							c += *p-'0';
						else
							break;
						p++;
					}
					result << c;
					break;
				default:
					result << *p;
					break;
			}
			p++;
		}
	}
	return result;
}